

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
PageHeapAlloc(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *this,Recycler *recycler,size_t sizeCat,size_t size,ObjectInfoBits attributes,
             PageHeapMode mode,bool nothrow)

{
  size_t *psVar1;
  bool bVar2;
  char *pcVar3;
  
  if (recycler->recyclerFlagsTable->Verbose == true) {
    bVar2 = Js::Phases::IsEnabled(&recycler->recyclerFlagsTable->Trace,MemoryAllocationPhase);
    if (bVar2) {
      Output::Print(L"In PageHeapAlloc [Size: 0x%x, Attributes: 0x%x]\n",size,(ulong)attributes);
    }
  }
  pcVar3 = LargeHeapBucket::PageHeapAlloc
                     (&((this->super_HeapBucket).heapInfo)->largeObjectBucket,recycler,sizeCat,size,
                      attributes,mode,nothrow);
  if (pcVar3 != (char *)0x0) {
    psVar1 = &(((this->super_HeapBucket).heapInfo)->recycler->autoHeap).uncollectedAllocBytes;
    *psVar1 = *psVar1 + sizeCat;
  }
  return pcVar3;
}

Assistant:

char *
HeapBucketT<TBlockType>::PageHeapAlloc(Recycler * recycler, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("In PageHeapAlloc [Size: 0x%x, Attributes: 0x%x]\n"), size, attributes);
    char* addr =  heapInfo->largeObjectBucket.PageHeapAlloc(recycler, sizeCat, size, attributes, mode, nothrow);

    if (addr)
    {
        this->GetRecycler()->autoHeap.uncollectedAllocBytes += sizeCat;
    }

    return addr;
}